

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ladspa.c
# Opt level: O0

int ladspa_segment_end(mixed_segment *segment)

{
  long *plVar1;
  ladspa_segment_data *data;
  mixed_segment *segment_local;
  
  plVar1 = (long *)segment->data;
  if ((char)plVar1[2] == '\0') {
    mixed_err(10);
    segment_local._4_4_ = 0;
  }
  else {
    if (*(long *)(*plVar1 + 0x88) == 0) {
      mixed_err(4);
    }
    else {
      (**(code **)(*plVar1 + 0x88))(plVar1[1]);
    }
    *(undefined1 *)(plVar1 + 2) = 0;
    segment_local._4_4_ = 1;
  }
  return segment_local._4_4_;
}

Assistant:

int ladspa_segment_end(struct mixed_segment *segment){
  struct ladspa_segment_data *data = (struct ladspa_segment_data *)segment->data;
  if(!data->active){
    mixed_err(MIXED_SEGMENT_ALREADY_ENDED);
    return 0;
  }
  
  if(data->descriptor->deactivate){
    data->descriptor->deactivate(data->handle);
  }else{
    mixed_err(MIXED_NOT_IMPLEMENTED);
  }
  data->active = 0;
  return 1;
}